

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

void __thiscall CVmObjByteArray::alloc_array(CVmObjByteArray *this,unsigned_long ele_count)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  void *pvVar3;
  void *pvVar4;
  uint32_t tmp;
  ulong uVar5;
  size_t __size;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar2 = ele_count - 1 >> 0x1c;
  lVar7 = 4;
  if (ele_count != 0) {
    lVar7 = uVar2 * 8 + 0xc;
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,lVar7,this);
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  *(int *)CONCAT44(extraout_var,iVar1) = (int)ele_count;
  if (ele_count != 0) {
    uVar5 = 0;
    do {
      uVar6 = ele_count - 1 >> 0xf;
      if (0x1ffe < uVar6) {
        uVar6 = 0x1fff;
      }
      pvVar3 = malloc((uVar6 & 0xffffffff) * 8 + 8);
      *(void **)((this->super_CVmObject).ext_ + uVar5 * 8 + 4) = pvVar3;
      lVar7 = 0;
      do {
        __size = 0x8000;
        if (ele_count < 0x8000) {
          __size = ele_count;
        }
        ele_count = ele_count - __size;
        pvVar4 = malloc(__size);
        *(void **)((long)pvVar3 + lVar7 * 8) = pvVar4;
        lVar7 = lVar7 + 1;
      } while (uVar6 + 1 != lVar7);
      bVar8 = uVar5 != uVar2;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void CVmObjByteArray::alloc_array(VMG_ unsigned long ele_count)
{
    unsigned long ele_rem;
    size_t slot_cnt;
    size_t alloc_size;
    size_t i;
    
    /* 
     *   figure out how many first-level page tables we need - each
     *   first-level page table refers to 256M bytes (8k pages per
     *   second-level page table times 32k bytes per page), so we need one
     *   page table pointer per 256 megabytes == 2^15*2^32 == 2^28.  
     */
    slot_cnt = (ele_count == 0 ? 0 : ((size_t)((ele_count - 1) >> 28) + 1));

    /* 
     *   allocate the extension - 4 bytes for the element count plus one
     *   (char **) per slot 
     */
    alloc_size = 4 + slot_cnt*sizeof(char **);
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(alloc_size, this);

    /* set the element count */
    set_element_count(ele_count);

    /* allocate the second-level page tables */
    for (ele_rem = ele_count, i = 0 ; i < slot_cnt ; ++i)
    {
        unsigned char **pgtab;
        unsigned long pgcnt;
        size_t pg;
        
        /* 
         *   Determine how many pages we need in this page table.  Each page
         *   holds 32k bytes, so we need one page per 32k bytes remaining to
         *   allocate.  However, each page table can hold only up to 8k page
         *   pointers, so limit this table to 8k pages. 
         */
        pgcnt = ((ele_rem - 1) >> 15) + 1;
        if (pgcnt > 8*1024)
            pgcnt = 8*1024;

        /* allocate this second-level page table */
        pgtab = (unsigned char **)t3malloc(
            (size_t)(pgcnt * sizeof(unsigned char *)));

        /* set this page table pointer */
        get_page_table_array()[i] = pgtab;

        /* allocate the pages in this table */
        for (pg = 0 ; pg < pgcnt ; ++pg)
        {
            size_t pgsiz;

            /* 
             *   calculate the size for this page - the maximum size of a
             *   page is 32k, but allocate only the amount remaining if we
             *   have less than 32k left to allocate 
             */
            pgsiz = 32*1024;
            if (pgsiz > ele_rem)
                pgsiz = (size_t)ele_rem;

            /* deduct this page's size from the remaining element count */
            ele_rem -= pgsiz;

            /* allocate and store this page */
            pgtab[pg] = (unsigned char *)t3malloc(pgsiz);
        }
    }
}